

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepInnerStepper_GetContent(MRIStepInnerStepper stepper,void **content)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepInnerStepper_GetContent",
                    "Inner stepper memory is NULL");
    local_4 = -0x16;
  }
  else {
    *in_RSI = *in_RDI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepInnerStepper_GetContent(MRIStepInnerStepper stepper,
                                   void **content)
{
  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepInnerStepper_GetContent",
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }
  *content = stepper->content;

  return ARK_SUCCESS;
}